

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NewFrame(void)

{
  ImDrawList *this;
  float *pfVar1;
  ImGuiID *pIVar2;
  bool *pbVar3;
  ImVec2 *pIVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar65;
  undefined8 uVar66;
  ImGuiID IVar7;
  ImFontAtlas *pIVar8;
  char *pcVar9;
  uchar *puVar10;
  ImGuiWindow **ppIVar11;
  ImGuiPopupRef *pIVar12;
  undefined1 auVar13 [12];
  ImGuiContext *pIVar14;
  ImGuiContext *pIVar15;
  ImGuiContext *pIVar16;
  ImGuiID IVar17;
  bool bVar18;
  int i;
  ImGuiInputSource IVar19;
  int iVar20;
  long lVar21;
  ImFont *font;
  ImGuiNavMoveResult *pIVar22;
  ImGuiWindow *pIVar23;
  ImGuiWindow **__dest;
  ImGuiPopupRef *__dest_00;
  bool bVar24;
  int i_1;
  ImGuiID IVar25;
  ImGuiWindow *pIVar26;
  ImGuiID IVar27;
  ImGuiWindow *parent_window;
  ulong uVar28;
  int iVar29;
  ImGuiContext *g_6;
  ImGuiID IVar30;
  float *pfVar31;
  ulong uVar32;
  ImGuiWindow *pIVar33;
  float *pfVar34;
  ImGuiContext *g_2;
  ImGuiNavMoveResult *pIVar35;
  ImGuiContext *g_1;
  ImGuiContext *g;
  bool bVar36;
  byte bVar37;
  uint uVar38;
  uint uVar39;
  float fVar40;
  ImVec2 IVar41;
  ImVec2 IVar42;
  ImVec2 IVar43;
  ImVec2 IVar44;
  undefined1 auVar45 [16];
  float fVar46;
  float fVar47;
  float fVar53;
  ImVec2 IVar48;
  ImVec2 IVar49;
  ImVec2 IVar50;
  ImVec2 IVar51;
  undefined1 auVar52 [16];
  float fVar54;
  ImVec2 IVar55;
  undefined1 auVar56 [16];
  float fVar57;
  float fVar59;
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  ImRect local_40;
  
  pIVar14 = GImGui;
  bVar37 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() or ImGui::SetCurrentContext()?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xd96,"void ImGui::NewFrame()");
  }
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xd9b,"void ImGui::NewFrame()");
  }
  fVar54 = (GImGui->IO).DeltaTime;
  if (fVar54 < 0.0) {
    __assert_fail("g.IO.DeltaTime >= 0.0f && \"Need a positive DeltaTime (zero is tolerated but will cause some timing issues)\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xd9c,"void ImGui::NewFrame()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xd9d,"void ImGui::NewFrame()");
  }
  pIVar8 = (GImGui->IO).Fonts;
  if ((pIVar8->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xd9e,"void ImGui::NewFrame()");
  }
  if ((*(pIVar8->Fonts).Data)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xd9f,"void ImGui::NewFrame()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xda0,"void ImGui::NewFrame()");
  }
  fVar46 = (GImGui->Style).Alpha;
  if ((fVar46 < 0.0) || (1.0 < fVar46)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xda1,"void ImGui::NewFrame()");
  }
  if ((GImGui->FrameCount != 0) && (GImGui->FrameCountEnded != GImGui->FrameCount)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xda2,"void ImGui::NewFrame()");
  }
  lVar21 = 0;
  do {
    if (0x200 < (GImGui->IO).KeyMap[lVar21] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown)/sizeof(*g.IO.KeysDown))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xda4,"void ImGui::NewFrame()");
    }
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0x15);
  if ((((GImGui->IO).ConfigFlags & 1) != 0) && ((GImGui->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xda8,"void ImGui::NewFrame()");
  }
  if (GImGui->SettingsLoaded == false) {
    if ((GImGui->SettingsWindows).Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xdad,"void ImGui::NewFrame()");
    }
    pcVar9 = (GImGui->IO).IniFilename;
    if (pcVar9 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar9);
      fVar54 = (pIVar14->IO).DeltaTime;
    }
    pIVar14->SettingsLoaded = true;
  }
  if ((0.0 < pIVar14->SettingsDirtyTimer) &&
     (fVar46 = pIVar14->SettingsDirtyTimer - fVar54, pIVar14->SettingsDirtyTimer = fVar46,
     fVar46 <= 0.0)) {
    pcVar9 = (pIVar14->IO).IniFilename;
    if (pcVar9 == (char *)0x0) {
      (pIVar14->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar9);
      fVar54 = (pIVar14->IO).DeltaTime;
    }
    pIVar14->SettingsDirtyTimer = 0.0;
  }
  pIVar14->Time = fVar54 + pIVar14->Time;
  pIVar14->FrameCount = pIVar14->FrameCount + 1;
  pIVar14->TooltipOverrideCount = 0;
  pIVar14->WindowsActiveCount = 0;
  font = GetDefaultFont();
  SetCurrentFont(font);
  if (pIVar14->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xdc7,"void ImGui::NewFrame()");
  }
  fVar54 = (pIVar14->IO).DisplaySize.x;
  fVar46 = (pIVar14->IO).DisplaySize.y;
  (pIVar14->DrawListSharedData).ClipRectFullscreen.x = 0.0;
  (pIVar14->DrawListSharedData).ClipRectFullscreen.y = 0.0;
  (pIVar14->DrawListSharedData).ClipRectFullscreen.z = fVar54;
  (pIVar14->DrawListSharedData).ClipRectFullscreen.w = fVar46;
  (pIVar14->DrawListSharedData).CurveTessellationTol = (pIVar14->Style).CurveTessellationTol;
  this = &pIVar14->OverlayDrawList;
  ImDrawList::Clear(this);
  ImDrawList::PushTextureID(this,((pIVar14->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(this);
  (pIVar14->OverlayDrawList).Flags =
       (uint)(pIVar14->Style).AntiAliasedLines + (uint)(pIVar14->Style).AntiAliasedFill * 2;
  (pIVar14->DrawData).Valid = false;
  (pIVar14->DrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar14->DrawData).CmdListsCount = 0;
  (pIVar14->DrawData).TotalIdxCount = 0;
  (pIVar14->DrawData).TotalVtxCount = 0;
  if (pIVar14->HoveredIdPreviousFrame == 0) {
    pIVar14->HoveredIdTimer = 0.0;
  }
  pIVar14->HoveredIdPreviousFrame = pIVar14->HoveredId;
  pIVar14->HoveredId = 0;
  pIVar14->HoveredIdAllowOverlap = false;
  pIVar15 = GImGui;
  if ((pIVar14->ActiveIdIsAlive == false) &&
     (pIVar14->ActiveId != 0 && pIVar14->ActiveIdPreviousFrame == pIVar14->ActiveId)) {
    bVar36 = GImGui->ActiveId != 0;
    GImGui->ActiveIdIsJustActivated = bVar36;
    if (bVar36) {
      pIVar15->ActiveIdTimer = 0.0;
    }
    pIVar15->ActiveId = 0;
    pIVar15->ActiveIdAllowNavDirFlags = 0;
    pIVar15->ActiveIdAllowOverlap = false;
    pIVar15->ActiveIdWindow = (ImGuiWindow *)0x0;
  }
  IVar7 = pIVar14->ActiveId;
  if (IVar7 != 0) {
    pIVar14->ActiveIdTimer = (pIVar14->IO).DeltaTime + pIVar14->ActiveIdTimer;
  }
  pIVar14->ActiveIdPreviousFrame = IVar7;
  pIVar14->ActiveIdIsAlive = false;
  pIVar14->ActiveIdIsJustActivated = false;
  if (IVar7 != pIVar14->ScalarAsInputTextId && pIVar14->ScalarAsInputTextId != 0) {
    pIVar14->ScalarAsInputTextId = 0;
  }
  pIVar15 = GImGui;
  if ((pIVar14->DragDropActive == true) &&
     ((pIVar14->DragDropPayload).DataFrameCount + 1 < pIVar14->FrameCount)) {
    GImGui->DragDropActive = false;
    (pIVar15->DragDropPayload).DataType[0] = '\0';
    (pIVar15->DragDropPayload).DataType[1] = '\0';
    (pIVar15->DragDropPayload).DataType[2] = '\0';
    (pIVar15->DragDropPayload).DataType[3] = '\0';
    (pIVar15->DragDropPayload).DataType[4] = '\0';
    (pIVar15->DragDropPayload).DataType[5] = '\0';
    (pIVar15->DragDropPayload).DataType[6] = '\0';
    (pIVar15->DragDropPayload).DataType[7] = '\0';
    (pIVar15->DragDropPayload).DataType[8] = '\0';
    (pIVar15->DragDropPayload).DataType[9] = '\0';
    (pIVar15->DragDropPayload).DataType[10] = '\0';
    (pIVar15->DragDropPayload).DataType[0xb] = '\0';
    (pIVar15->DragDropPayload).DataType[0xc] = '\0';
    (pIVar15->DragDropPayload).DataType[0xd] = '\0';
    (pIVar15->DragDropPayload).DataType[0xe] = '\0';
    (pIVar15->DragDropPayload).DataType[0xf] = '\0';
    (pIVar15->DragDropPayload).DataType[0x10] = '\0';
    (pIVar15->DragDropPayload).DataType[0x11] = '\0';
    (pIVar15->DragDropPayload).DataType[0x12] = '\0';
    (pIVar15->DragDropPayload).DataType[0x13] = '\0';
    (pIVar15->DragDropPayload).DataType[0x14] = '\0';
    (pIVar15->DragDropPayload).DataType[0x15] = '\0';
    (pIVar15->DragDropPayload).DataType[0x16] = '\0';
    (pIVar15->DragDropPayload).DataType[0x17] = '\0';
    (pIVar15->DragDropPayload).DataType[0x18] = '\0';
    (pIVar15->DragDropPayload).DataType[0x19] = '\0';
    (pIVar15->DragDropPayload).DataType[0x1a] = '\0';
    (pIVar15->DragDropPayload).DataType[0x1b] = '\0';
    (pIVar15->DragDropPayload).DataType[0x1c] = '\0';
    (pIVar15->DragDropPayload).DataType[0x1d] = '\0';
    (pIVar15->DragDropPayload).DataType[0x1e] = '\0';
    (pIVar15->DragDropPayload).DataType[0x1f] = '\0';
    (pIVar15->DragDropPayload).DataType[0x20] = '\0';
    (pIVar15->DragDropPayload).Data = (void *)0x0;
    (pIVar15->DragDropPayload).DataSize = 0;
    (pIVar15->DragDropPayload).SourceId = 0;
    (pIVar15->DragDropPayload).SourceParentId = 0;
    (pIVar15->DragDropPayload).DataFrameCount = -1;
    (pIVar15->DragDropPayload).Preview = false;
    (pIVar15->DragDropPayload).Delivery = false;
    pIVar15->DragDropAcceptIdPrev = 0;
    pIVar15->DragDropAcceptFrameCount = -1;
    pIVar15->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
    pIVar15->DragDropAcceptIdCurr = 0;
    puVar10 = (pIVar14->DragDropPayloadBufHeap).Data;
    if (puVar10 != (uchar *)0x0) {
      (pIVar14->DragDropPayloadBufHeap).Size = 0;
      (pIVar14->DragDropPayloadBufHeap).Capacity = 0;
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      (*GImAllocatorFreeFunc)(puVar10,GImAllocatorUserData);
      (pIVar14->DragDropPayloadBufHeap).Data = (uchar *)0x0;
    }
    pIVar14->DragDropPayloadBufLocal[0] = '\0';
    pIVar14->DragDropPayloadBufLocal[1] = '\0';
    pIVar14->DragDropPayloadBufLocal[2] = '\0';
    pIVar14->DragDropPayloadBufLocal[3] = '\0';
    pIVar14->DragDropPayloadBufLocal[4] = '\0';
    pIVar14->DragDropPayloadBufLocal[5] = '\0';
    pIVar14->DragDropPayloadBufLocal[6] = '\0';
    pIVar14->DragDropPayloadBufLocal[7] = '\0';
  }
  pIVar14->DragDropAcceptIdPrev = pIVar14->DragDropAcceptIdCurr;
  pIVar14->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar14->DragDropAcceptIdCurr = 0;
  pfVar1 = (pIVar14->IO).KeysDownDuration;
  memcpy((pIVar14->IO).KeysDownDurationPrev,pfVar1,0x800);
  lVar21 = 0;
  do {
    fVar54 = -1.0;
    if ((pIVar14->IO).KeysDown[lVar21] == true) {
      fVar54 = 0.0;
      if (0.0 <= pfVar1[lVar21]) {
        fVar54 = pfVar1[lVar21] + (pIVar14->IO).DeltaTime;
      }
    }
    pfVar1[lVar21] = fVar54;
    pIVar15 = GImGui;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0x200);
  (GImGui->IO).WantSetMousePos = false;
  uVar38 = (pIVar15->IO).ConfigFlags;
  if ((((uVar38 & 2) != 0) && (((pIVar15->IO).BackendFlags & 1) != 0)) &&
     ((0.0 < (pIVar15->IO).NavInputs[0] ||
      (((0.0 < (pIVar15->IO).NavInputs[2] || (0.0 < (pIVar15->IO).NavInputs[1])) ||
       (0.0 < (pIVar15->IO).NavInputs[3])))))) {
    pIVar15->NavInputSource = ImGuiInputSource_NavGamepad;
  }
  if ((uVar38 & 1) != 0) {
    uVar38 = (pIVar15->IO).KeyMap[0xc];
    if (-1 < (long)(int)uVar38) {
      if (0x1ff < uVar38) goto LAB_00165288;
      if ((pIVar15->IO).KeysDown[(int)uVar38] == true) {
        (pIVar15->IO).NavInputs[0] = 1.0;
        pIVar15->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar38 = (pIVar15->IO).KeyMap[0xd];
    if (-1 < (long)(int)uVar38) {
      if (0x1ff < uVar38) goto LAB_00165288;
      if ((pIVar15->IO).KeysDown[(int)uVar38] == true) {
        (pIVar15->IO).NavInputs[2] = 1.0;
        pIVar15->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar38 = (pIVar15->IO).KeyMap[0xe];
    if (-1 < (long)(int)uVar38) {
      if (0x1ff < uVar38) goto LAB_00165288;
      if ((pIVar15->IO).KeysDown[(int)uVar38] == true) {
        (pIVar15->IO).NavInputs[1] = 1.0;
        pIVar15->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar38 = (pIVar15->IO).KeyMap[1];
    if (-1 < (long)(int)uVar38) {
      if (0x1ff < uVar38) goto LAB_00165288;
      if ((pIVar15->IO).KeysDown[(int)uVar38] == true) {
        (pIVar15->IO).NavInputs[0x11] = 1.0;
        pIVar15->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar38 = (pIVar15->IO).KeyMap[2];
    if (-1 < (long)(int)uVar38) {
      if (0x1ff < uVar38) goto LAB_00165288;
      if ((pIVar15->IO).KeysDown[(int)uVar38] == true) {
        (pIVar15->IO).NavInputs[0x12] = 1.0;
        pIVar15->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar38 = (pIVar15->IO).KeyMap[3];
    if (-1 < (long)(int)uVar38) {
      if (0x1ff < uVar38) goto LAB_00165288;
      if ((pIVar15->IO).KeysDown[(int)uVar38] == true) {
        (pIVar15->IO).NavInputs[0x13] = 1.0;
        pIVar15->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar38 = (pIVar15->IO).KeyMap[4];
    if (-1 < (long)(int)uVar38) {
      if (0x1ff < uVar38) {
LAB_00165288:
        __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(GImGui->IO.KeysDown)/sizeof(*GImGui->IO.KeysDown)))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                      ,0x120f,"bool ImGui::IsKeyDown(int)");
      }
      if ((pIVar15->IO).KeysDown[(int)uVar38] == true) {
        (pIVar15->IO).NavInputs[0x14] = 1.0;
        pIVar15->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    if ((pIVar15->IO).KeyCtrl == true) {
      (pIVar15->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar15->IO).KeyShift == true) {
      (pIVar15->IO).NavInputs[0xf] = 1.0;
    }
    if ((pIVar15->IO).KeyAlt == true) {
      (pIVar15->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar1 = (pIVar15->IO).NavInputsDownDuration;
  pfVar31 = pfVar1;
  pfVar34 = (pIVar15->IO).NavInputsDownDurationPrev;
  for (lVar21 = 0x15; lVar21 != 0; lVar21 = lVar21 + -1) {
    *pfVar34 = *pfVar31;
    pfVar31 = pfVar31 + (ulong)bVar37 * -2 + 1;
    pfVar34 = pfVar34 + (ulong)bVar37 * -2 + 1;
  }
  lVar21 = 0;
  do {
    fVar54 = -1.0;
    if (0.0 < (pIVar15->IO).NavInputs[lVar21]) {
      fVar54 = 0.0;
      if (0.0 <= pfVar1[lVar21]) {
        fVar54 = pfVar1[lVar21] + (pIVar15->IO).DeltaTime;
      }
    }
    pfVar1[lVar21] = fVar54;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0x15);
  IVar7 = pIVar15->NavInitResultId;
  if ((IVar7 != 0) &&
     ((pIVar15->NavDisableHighlight != true || (pIVar15->NavInitRequestFromMove == true)))) {
    if (pIVar15->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xc08,"void ImGui::NavUpdate()");
    }
    iVar29 = pIVar15->NavLayer;
    if (pIVar15->NavInitRequestFromMove == true) {
      SetNavID(IVar7,iVar29);
      IVar41 = (pIVar15->NavInitResultRectRel).Max;
      pIVar4 = &pIVar15->NavWindow->NavRectRel[iVar29].Min;
      *pIVar4 = (pIVar15->NavInitResultRectRel).Min;
      pIVar4[1] = IVar41;
      pIVar15->NavMousePosDirty = true;
      pIVar15->NavDisableHighlight = false;
      pIVar15->NavDisableMouseHover = true;
    }
    else {
      SetNavID(IVar7,iVar29);
    }
    IVar41 = (pIVar15->NavInitResultRectRel).Max;
    pIVar4 = &pIVar15->NavWindow->NavRectRel[pIVar15->NavLayer].Min;
    *pIVar4 = (pIVar15->NavInitResultRectRel).Min;
    pIVar4[1] = IVar41;
  }
  pIVar15->NavInitRequest = false;
  pIVar15->NavInitRequestFromMove = false;
  pIVar15->NavInitResultId = 0;
  pIVar15->NavJustMovedToId = 0;
  if (pIVar15->NavMoveRequest == true) {
    pIVar35 = &pIVar15->NavMoveResultOther;
    IVar7 = (pIVar15->NavMoveResultOther).ID;
    if ((pIVar15->NavMoveResultLocal).ID == 0) {
      pIVar22 = pIVar35;
      if (IVar7 != 0) goto LAB_00163610;
    }
    else {
      pIVar22 = &pIVar15->NavMoveResultLocal;
      if (IVar7 == 0) {
        pIVar23 = pIVar15->NavWindow;
LAB_00163631:
        pIVar26 = pIVar23;
        pIVar35 = pIVar22;
      }
      else {
LAB_00163610:
        pIVar23 = pIVar15->NavWindow;
        pIVar26 = ((pIVar15->NavMoveResultOther).Window)->ParentWindow;
        if (pIVar26 != pIVar23) goto LAB_00163631;
        fVar54 = (pIVar15->NavMoveResultLocal).DistBox;
        fVar46 = (pIVar15->NavMoveResultOther).DistBox;
        if ((fVar54 <= fVar46) &&
           (((pIVar23 = pIVar26, fVar46 != fVar54 || (NAN(fVar46) || NAN(fVar54))) ||
            (fVar54 = (pIVar15->NavMoveResultLocal).DistCenter,
            pfVar1 = &(pIVar15->NavMoveResultOther).DistCenter,
            fVar54 < *pfVar1 || fVar54 == *pfVar1)))) goto LAB_00163631;
      }
      if ((pIVar26 == (ImGuiWindow *)0x0) ||
         (pIVar23 = pIVar35->Window, pIVar23 == (ImGuiWindow *)0x0)) {
        __assert_fail("g.NavWindow && result->Window",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                      ,0xc1d,"void ImGui::NavUpdate()");
      }
      if (pIVar15->NavLayer == 0) {
        IVar41 = (pIVar35->RectRel).Min;
        IVar48 = (pIVar35->RectRel).Max;
        fVar54 = (pIVar23->Pos).x;
        local_40.Min.x = IVar41.x + fVar54;
        fVar46 = (pIVar23->Pos).y;
        local_40.Min.y = IVar41.y + fVar46;
        local_40.Max.x = IVar48.x + fVar54;
        local_40.Max.y = IVar48.y + fVar46;
        NavScrollToBringItemIntoView(pIVar23,&local_40);
        pIVar23 = pIVar35->Window;
        if ((pIVar23->Flags & 0x1000000) != 0) {
          NavScrollToBringItemIntoView(pIVar23->ParentWindow,&local_40);
          pIVar23 = pIVar35->Window;
        }
        IVar41 = CalcNextScrollFromScrollTargetAndClamp(pIVar23,false);
        fVar47 = (pIVar23->Scroll).x - IVar41.x;
        fVar53 = (pIVar23->Scroll).y - IVar41.y;
        fVar54 = (pIVar35->RectRel).Min.y;
        fVar46 = (pIVar35->RectRel).Max.x;
        fVar40 = (pIVar35->RectRel).Max.y;
        (pIVar35->RectRel).Min.x = (pIVar35->RectRel).Min.x + fVar47;
        (pIVar35->RectRel).Min.y = fVar54 + fVar53;
        (pIVar35->RectRel).Max.x = fVar46 + fVar47;
        (pIVar35->RectRel).Max.y = fVar40 + fVar53;
      }
      pIVar16 = GImGui;
      bVar36 = GImGui->ActiveId != 0;
      GImGui->ActiveIdIsJustActivated = bVar36;
      if (bVar36) {
        pIVar16->ActiveIdTimer = 0.0;
      }
      pIVar16->ActiveId = 0;
      pIVar16->ActiveIdAllowNavDirFlags = 0;
      pIVar16->ActiveIdAllowOverlap = false;
      pIVar16->ActiveIdWindow = (ImGuiWindow *)0x0;
      pIVar15->NavWindow = pIVar23;
      iVar29 = pIVar15->NavLayer;
      SetNavID(pIVar35->ID,iVar29);
      IVar41 = (pIVar35->RectRel).Max;
      pIVar4 = &pIVar16->NavWindow->NavRectRel[iVar29].Min;
      *pIVar4 = (pIVar35->RectRel).Min;
      pIVar4[1] = IVar41;
      pIVar16->NavMousePosDirty = true;
      pIVar16->NavDisableHighlight = false;
      pIVar16->NavDisableMouseHover = true;
      pIVar15->NavJustMovedToId = pIVar35->ID;
      pIVar15->NavMoveFromClampedRefRect = false;
    }
  }
  if (pIVar15->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar15->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xc37,"void ImGui::NavUpdate()");
    }
    if (((pIVar15->NavMoveResultLocal).ID == 0) && ((pIVar15->NavMoveResultOther).ID == 0)) {
      pIVar15->NavDisableHighlight = false;
    }
    pIVar15->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar15->NavMousePosDirty == true) && (pIVar15->NavIdIsAlive == true)) {
    if ((((pIVar15->IO).ConfigFlags & 4) != 0) && (((pIVar15->IO).BackendFlags & 4) != 0)) {
      if ((pIVar15->NavDisableHighlight != false) || (pIVar15->NavDisableMouseHover == false)) {
        __assert_fail("!g.NavDisableHighlight && g.NavDisableMouseHover",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                      ,0xc43,"void ImGui::NavUpdate()");
      }
      IVar41 = NavCalcPreferredRefPos();
      (pIVar15->IO).MousePosPrev = IVar41;
      (pIVar15->IO).MousePos = IVar41;
      (pIVar15->IO).WantSetMousePos = true;
    }
    pIVar15->NavMousePosDirty = false;
  }
  pIVar15->NavIdIsAlive = false;
  pIVar15->NavJustTabbedId = 0;
  uVar38 = pIVar15->NavLayer;
  if (1 < uVar38) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xc4b,"void ImGui::NavUpdate()");
  }
  pIVar23 = pIVar15->NavWindow;
  pIVar26 = pIVar23;
  if (pIVar23 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar26->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar26 != pIVar23) {
          pIVar26->NavLastChildNavWindow = pIVar23;
        }
        break;
      }
      ppIVar11 = &pIVar26->ParentWindow;
      pIVar26 = *ppIVar11;
    } while (*ppIVar11 != (ImGuiWindow *)0x0);
    if ((uVar38 == 0) && (pIVar23->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar23->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar16 = GImGui;
  if (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0) {
    fVar54 = (GImGui->IO).NavInputsDownDuration[3];
    if ((((GImGui->IO).KeyCtrl == true) && (iVar29 = (GImGui->IO).KeyMap[0], -1 < iVar29)) &&
       (bVar36 = IsKeyPressed(iVar29,true), bVar36)) {
      bVar37 = (byte)(pIVar16->IO).ConfigFlags;
      uVar38 = (uint)bVar37;
      if (fVar54 == 0.0 || (bVar37 & 1) != 0) {
LAB_0016390d:
        pIVar23 = pIVar16->NavWindow;
        if ((pIVar23 != (ImGuiWindow *)0x0) ||
           (pIVar23 = FindWindowNavigable((pIVar16->Windows).Size + -1,-0x7fffffff,-1),
           pIVar23 != (ImGuiWindow *)0x0)) {
          pIVar16->NavWindowingTarget = pIVar23->RootWindowForTabbing;
          pIVar16->NavWindowingHighlightTimer = 0.0;
          pIVar16->NavWindowingHighlightAlpha = 0.0;
          pIVar16->NavWindowingToggleLayer = (bool)(~(byte)uVar38 & 1);
          pIVar16->NavInputSource = ImGuiInputSource_NavGamepad - (uVar38 & 1);
        }
      }
    }
    else if ((fVar54 == 0.0) && (!NAN(fVar54))) {
      uVar38 = 0;
      goto LAB_0016390d;
    }
    fVar54 = (pIVar16->IO).DeltaTime + pIVar16->NavWindowingHighlightTimer;
    pIVar16->NavWindowingHighlightTimer = fVar54;
    if (pIVar16->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_0016399f;
LAB_00163b2f:
    bVar36 = false;
    pIVar23 = (ImGuiWindow *)0x0;
  }
  else {
    fVar54 = (GImGui->IO).DeltaTime + GImGui->NavWindowingHighlightTimer;
    GImGui->NavWindowingHighlightTimer = fVar54;
LAB_0016399f:
    IVar19 = pIVar16->NavInputSource;
    if (IVar19 != ImGuiInputSource_NavGamepad) {
LAB_00163a93:
      if (IVar19 == ImGuiInputSource_NavKeyboard) {
        fVar46 = (pIVar16->NavWindowingHighlightTimer + -0.15) / 0.04;
        fVar54 = 1.0;
        if (fVar46 <= 1.0) {
          fVar54 = fVar46;
        }
        fVar54 = (float)(~-(uint)(fVar46 < 0.0) & (uint)fVar54);
        uVar38 = -(uint)(fVar54 <= pIVar16->NavWindowingHighlightAlpha);
        pIVar16->NavWindowingHighlightAlpha =
             (float)(uVar38 & (uint)pIVar16->NavWindowingHighlightAlpha | ~uVar38 & (uint)fVar54);
        iVar29 = (GImGui->IO).KeyMap[0];
        if ((-1 < iVar29) && (bVar36 = IsKeyPressed(iVar29,true), bVar36)) {
          NavUpdateWindowingHighlightWindow((pIVar16->IO).KeyShift - 1 | 1);
        }
        if ((pIVar16->IO).KeyCtrl == false) {
          pIVar23 = pIVar16->NavWindowingTarget;
          bVar36 = false;
          goto LAB_00163bc8;
        }
      }
      goto LAB_00163b2f;
    }
    fVar46 = (fVar54 + -0.2) / 0.05;
    fVar54 = 1.0;
    if (fVar46 <= 1.0) {
      fVar54 = fVar46;
    }
    fVar54 = (float)(~-(uint)(fVar46 < 0.0) & (uint)fVar54);
    uVar38 = -(uint)(fVar54 <= pIVar16->NavWindowingHighlightAlpha);
    fVar40 = (float)(uVar38 & (uint)pIVar16->NavWindowingHighlightAlpha | ~uVar38 & (uint)fVar54);
    pIVar16->NavWindowingHighlightAlpha = fVar40;
    fVar54 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
    fVar46 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
    iVar29 = (uint)(0.0 < fVar54) - (uint)(0.0 < fVar46);
    if (iVar29 != 0) {
      NavUpdateWindowingHighlightWindow(iVar29);
      pIVar16->NavWindowingHighlightAlpha = 1.0;
      fVar40 = 1.0;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) {
      if (pIVar16->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_00163b2f;
      IVar19 = pIVar16->NavInputSource;
      goto LAB_00163a93;
    }
    pbVar3 = &pIVar16->NavWindowingToggleLayer;
    *pbVar3 = (bool)(*pbVar3 & fVar40 < 1.0);
    if (*pbVar3 == false) {
      pIVar23 = pIVar16->NavWindowingTarget;
      bVar36 = false;
    }
    else {
      bVar36 = pIVar16->NavWindow != (ImGuiWindow *)0x0;
      pIVar23 = (ImGuiWindow *)0x0;
    }
    pIVar16->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
LAB_00163bc8:
  if ((((pIVar16->ActiveId == 0) || (pIVar16->ActiveIdAllowOverlap == true)) &&
      (pfVar1 = (GImGui->IO).NavInputsDownDuration + 0x10, *pfVar1 <= 0.0 && *pfVar1 != 0.0)) &&
     (0.0 <= (GImGui->IO).NavInputsDownDurationPrev[0x10])) {
    if (-256000.0 <= (pIVar16->IO).MousePos.x) {
      bVar18 = -256000.0 <= (pIVar16->IO).MousePos.y;
    }
    else {
      bVar18 = false;
    }
    if (-256000.0 <= (pIVar16->IO).MousePosPrev.x) {
      bVar24 = -256000.0 <= (pIVar16->IO).MousePosPrev.y;
    }
    else {
      bVar24 = false;
    }
    bVar36 = (bool)(bVar36 | bVar18 ^ bVar24 ^ 1U);
  }
  pIVar26 = pIVar16->NavWindowingTarget;
  if ((pIVar26 != (ImGuiWindow *)0x0) && (uVar38 = pIVar26->Flags, (uVar38 & 4) == 0)) {
    IVar19 = pIVar16->NavInputSource;
    if ((IVar19 == ImGuiInputSource_NavGamepad) ||
       ((IVar41.x = 0.0, IVar41.y = 0.0, IVar19 == ImGuiInputSource_NavKeyboard &&
        (IVar19 = ImGuiInputSource_Mouse, (pIVar16->IO).KeyShift == false)))) {
      IVar41 = GetNavInputAmount2d(IVar19,ImGuiInputReadMode_Down,0.0,0.0);
    }
    fVar54 = IVar41.y;
    if (((IVar41.x != 0.0) || (fVar54 != 0.0)) || (NAN(fVar54))) {
      fVar46 = (pIVar16->IO).DisplayFramebufferScale.x;
      fVar40 = (pIVar16->IO).DisplayFramebufferScale.y;
      if (fVar40 <= fVar46) {
        fVar46 = fVar40;
      }
      fVar46 = (float)(int)(fVar46 * (pIVar16->IO).DeltaTime * 800.0);
      IVar48.x = (pIVar26->Pos).x + IVar41.x * fVar46;
      IVar48.y = (pIVar26->Pos).y + fVar54 * fVar46;
      pIVar26->Pos = IVar48;
      pIVar16->NavDisableMouseHover = true;
      if (((uVar38 >> 8 & 1) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
        GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
      }
    }
  }
  if (pIVar23 != (ImGuiWindow *)0x0) {
    if ((pIVar16->NavWindow == (ImGuiWindow *)0x0) ||
       (pIVar23 != pIVar16->NavWindow->RootWindowForTabbing)) {
      pIVar16->NavDisableHighlight = false;
      pIVar16->NavDisableMouseHover = true;
      pIVar26 = pIVar23->NavLastChildNavWindow;
      if (pIVar23->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
        pIVar26 = pIVar23;
      }
      ClosePopupsOverWindow(pIVar26);
      FocusWindow(pIVar26);
      if (pIVar26->NavLastIds[0] == 0) {
        NavInitWindow(pIVar26,false);
      }
      if ((pIVar26->DC).NavLayerActiveMask == 2) {
        pIVar16->NavLayer = 1;
      }
    }
    pIVar16->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar36) && (pIVar23 = pIVar16->NavWindow, pIVar23 != (ImGuiWindow *)0x0)) {
    pIVar26 = pIVar23;
    if (((pIVar23->DC).NavLayerActiveMask & 2) == 0) {
      do {
        if ((pIVar26->Flags & 0x15000000U) != 0x1000000) break;
        pIVar26 = pIVar26->ParentWindow;
      } while (((pIVar26->DC).NavLayerActiveMask & 2) == 0);
      if (pIVar26 == pIVar23) {
        pIVar16->NavDisableHighlight = false;
        pIVar16->NavDisableMouseHover = true;
        uVar38 = 0;
      }
      else {
        FocusWindow(pIVar26);
        pIVar26->NavLastChildNavWindow = pIVar23;
        uVar38 = 0;
        iVar29 = (pIVar16->NavWindow->DC).NavLayerActiveMask;
        pIVar16->NavDisableHighlight = false;
        pIVar16->NavDisableMouseHover = true;
        if ((iVar29 & 2) != 0) goto LAB_00163e43;
      }
    }
    else {
      pIVar16->NavDisableHighlight = false;
      pIVar16->NavDisableMouseHover = true;
LAB_00163e43:
      uVar38 = pIVar16->NavLayer ^ 1;
    }
    NavRestoreLayer(uVar38);
  }
  uVar38 = (pIVar15->IO).ConfigFlags;
  if ((uVar38 & 2) == 0) {
    bVar37 = 0;
  }
  else {
    bVar37 = (byte)(pIVar15->IO).BackendFlags & 1;
  }
  if ((((uVar38 & 1) == 0) && (bVar37 == 0)) || (pIVar15->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar15->IO).NavActive = false;
LAB_00163eba:
    bVar36 = true;
    if (pIVar15->NavWindowingTarget == (ImGuiWindow *)0x0) {
      bVar36 = pIVar15->NavInitRequest;
    }
  }
  else {
    bVar36 = (pIVar15->NavWindow->Flags & 0x40000U) == 0;
    (pIVar15->IO).NavActive = bVar36;
    if (((!bVar36) || (pIVar15->NavId == 0)) ||
       (bVar36 = true, pIVar15->NavDisableHighlight != false)) goto LAB_00163eba;
  }
  (pIVar15->IO).NavVisible = bVar36;
  pIVar16 = GImGui;
  fVar54 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar54 == 0.0) && (!NAN(fVar54))) {
    if (pIVar15->ActiveId == 0) {
      pIVar23 = pIVar15->NavWindow;
      if (((pIVar23 == (ImGuiWindow *)0x0) || ((pIVar23->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar23->ParentWindow == (ImGuiWindow *)0x0)) {
        iVar29 = (pIVar15->OpenPopupStack).Size;
        if ((long)iVar29 < 1) {
          if (pIVar15->NavLayer == 0) {
            if ((pIVar23 != (ImGuiWindow *)0x0) && ((pIVar23->Flags & 0x5000000U) != 0x1000000)) {
              pIVar23->NavLastIds[0] = 0;
            }
            pIVar15->NavId = 0;
          }
          else {
            NavRestoreLayer(0);
          }
        }
        else if ((((pIVar15->OpenPopupStack).Data[(long)iVar29 + -1].Window)->Flags & 0x8000000) ==
                 0) {
          ClosePopupToLevel(iVar29 + -1);
        }
      }
      else {
        if (pIVar23->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                        ,0xc67,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar23->ParentWindow);
        ppIVar11 = &GImGui->NavWindow;
        if (*ppIVar11 == (ImGuiWindow *)0x0) {
          __assert_fail("g.NavWindow",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                        ,0x81b,"void SetNavID(ImGuiID, int)");
        }
        IVar7 = pIVar23->ChildId;
        GImGui->NavId = IVar7;
        (*ppIVar11)->NavLastIds[0] = IVar7;
        pIVar15->NavIdIsAlive = false;
        if (pIVar15->NavDisableMouseHover == true) {
          pIVar15->NavMousePosDirty = true;
        }
      }
    }
    else {
      bVar36 = GImGui->ActiveId != 0;
      GImGui->ActiveIdIsJustActivated = bVar36;
      if (bVar36) {
        pIVar16->ActiveIdTimer = 0.0;
      }
      pIVar16->ActiveId = 0;
      pIVar16->ActiveIdAllowNavDirFlags = 0;
      pIVar16->ActiveIdAllowOverlap = false;
      pIVar16->ActiveIdWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar15->NavActivateId = 0;
  pIVar15->NavActivateDownId = 0;
  pIVar15->NavActivatePressedId = 0;
  pIVar16 = GImGui;
  pIVar15->NavInputId = 0;
  IVar7 = pIVar15->NavId;
  IVar25 = 0;
  if ((IVar7 == 0) || (pIVar15->NavDisableHighlight != false)) {
    IVar27 = 0;
LAB_00163f6f:
    pIVar23 = pIVar15->NavWindow;
    bVar36 = pIVar23 == (ImGuiWindow *)0x0;
    if ((!bVar36) && ((pIVar23->Flags & 0x40000) != 0)) {
      pIVar15->NavDisableHighlight = true;
    }
    if (IVar25 != IVar27 && IVar27 != 0) {
      __assert_fail("g.NavActivateDownId == g.NavActivateId",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xc94,"void ImGui::NavUpdate()");
    }
  }
  else {
    IVar27 = 0;
    if (pIVar15->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_00163f6f;
    IVar25 = 0;
    if (pIVar15->NavWindow != (ImGuiWindow *)0x0) {
      if ((pIVar15->NavWindow->Flags & 0x40000) == 0) {
        if (0.0 < (GImGui->IO).NavInputs[0]) {
          fVar54 = (GImGui->IO).NavInputsDownDuration[0];
          IVar17 = IVar7;
          if (0.0 <= fVar54) {
            IVar30 = pIVar15->ActiveId;
            if (IVar30 == 0 && fVar54 == 0.0) {
              pIVar15->NavActivateId = IVar7;
              pIVar15->NavActivateDownId = IVar7;
              IVar27 = IVar7;
            }
            else {
              if (IVar30 == 0) {
                pIVar15->NavActivateDownId = IVar7;
              }
              else {
                if (IVar30 != IVar7) goto LAB_00164361;
                pIVar15->NavActivateDownId = IVar7;
              }
              IVar27 = 0;
              if ((fVar54 != 0.0) || (IVar27 = 0, NAN(fVar54))) goto LAB_001651ef;
            }
            pIVar15->NavActivatePressedId = IVar7;
          }
          else {
            IVar30 = pIVar15->ActiveId;
            if ((IVar30 != 0) && (IVar30 != IVar7)) goto LAB_00164361;
            pIVar15->NavActivateDownId = IVar7;
            IVar27 = 0;
          }
        }
        else {
          IVar30 = pIVar15->ActiveId;
          if (IVar30 == 0) {
            IVar27 = 0;
            IVar17 = 0;
          }
          else {
LAB_00164361:
            IVar25 = 0;
            IVar27 = 0;
            IVar17 = 0;
            if (IVar30 != IVar7) goto LAB_00163f6f;
          }
        }
LAB_001651ef:
        IVar25 = IVar17;
        fVar54 = (pIVar16->IO).NavInputsDownDuration[2];
        if ((fVar54 == 0.0) && (!NAN(fVar54))) {
          pIVar15->NavInputId = IVar7;
        }
      }
      goto LAB_00163f6f;
    }
    bVar36 = true;
    pIVar23 = (ImGuiWindow *)0x0;
  }
  pIVar15->NavMoveRequest = false;
  IVar25 = pIVar15->NavNextActivateId;
  if (IVar25 != 0) {
    pIVar15->NavActivateId = IVar25;
    pIVar15->NavActivateDownId = IVar25;
    pIVar15->NavActivatePressedId = IVar25;
    pIVar15->NavInputId = IVar25;
  }
  pIVar15->NavNextActivateId = 0;
  if (pIVar15->ActiveId == 0) {
    uVar38 = 0xffffffff;
  }
  else {
    uVar38 = pIVar15->ActiveIdAllowNavDirFlags;
  }
  if (pIVar15->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar15->NavMoveDir = -1;
    pIVar15->NavMoveRequestFlags = 0;
    if (((bVar36) || (uVar38 == 0 || pIVar15->NavWindowingTarget != (ImGuiWindow *)0x0)) ||
       ((pIVar23->Flags & 0x40000) != 0)) {
      pIVar15->NavMoveClipDir = -1;
    }
    else {
      uVar39 = 0xffffffff;
      if ((uVar38 & 1) != 0) {
        fVar54 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat);
        fVar46 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar46 + fVar54) {
          pIVar15->NavMoveDir = 0;
          uVar39 = 0;
        }
      }
      if ((uVar38 & 2) != 0) {
        fVar54 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat);
        fVar46 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar46 + fVar54) {
          pIVar15->NavMoveDir = 1;
          uVar39 = 1;
        }
      }
      if ((uVar38 & 4) != 0) {
        fVar54 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat);
        fVar46 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar46 + fVar54) {
          pIVar15->NavMoveDir = 2;
          uVar39 = 2;
        }
      }
      if ((uVar38 & 8) != 0) {
        bVar36 = false;
        fVar54 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat);
        fVar46 = GetNavInputAmount(0x14,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar46 + fVar54) {
          pIVar15->NavMoveDir = 3;
          pIVar15->NavMoveClipDir = 3;
          uVar39 = 3;
          goto LAB_00164027;
        }
      }
      pIVar15->NavMoveClipDir = uVar39;
      if (uVar39 != 0xffffffff) goto LAB_00164027;
    }
    uVar39 = 0xffffffff;
    bVar37 = 0;
  }
  else {
    uVar39 = pIVar15->NavMoveDir;
    if ((uVar39 == 0xffffffff) || (pIVar15->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xcaf,"void ImGui::NavUpdate()");
    }
    if (pIVar15->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xcb0,"void ImGui::NavUpdate()");
    }
    pIVar15->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
LAB_00164027:
    pIVar15->NavMoveRequest = true;
    pIVar15->NavMoveDirLast = uVar39;
    bVar37 = 1;
    if (IVar7 == 0) {
      pIVar15->NavInitRequest = true;
      pIVar15->NavInitRequestFromMove = true;
      pIVar15->NavInitResultId = 0;
      pIVar15->NavDisableHighlight = false;
      bVar37 = 1;
    }
  }
  pIVar16 = GImGui;
  if (GImGui->NavMoveRequest == false) {
    pbVar3 = &GImGui->NavInitRequest;
    GImGui->NavAnyRequest = *pbVar3;
    if (*pbVar3 != false) goto LAB_0016419b;
  }
  else {
    GImGui->NavAnyRequest = true;
LAB_0016419b:
    if (pIVar16->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x95f,"void NavUpdateAnyRequestFlag()");
    }
  }
  if (((!bVar36) && ((pIVar23->Flags & 0x40000) == 0)) &&
     (pIVar15->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar54 = (float)(int)(pIVar16->FontBaseSize * pIVar23->FontWindowScale * 100.0 *
                          (pIVar15->IO).DeltaTime + 0.5);
    if (((pIVar23->DC).NavLayerActiveMask == 0) && ((bVar37 & (pIVar23->DC).NavHasScroll) == 1)) {
      if (uVar39 < 2) {
        fVar46 = (pIVar23->Scroll).x;
        fVar40 = (pIVar23->DC).CursorMaxPos.x;
        fVar47 = (float)(int)(*(float *)(&DAT_001c57a8 + (ulong)(uVar39 == 0) * 4) * fVar54 + fVar46
                             );
        (pIVar23->Scroll).x = fVar47;
        (pIVar23->DC).CursorMaxPos.x = (fVar46 + fVar40) - fVar47;
      }
      else if ((uVar39 & 0xfffffffe) == 2) {
        fVar46 = (pIVar23->Scroll).y;
        fVar40 = (pIVar23->DC).CursorMaxPos.y;
        fVar47 = (float)(int)(*(float *)(&DAT_001c57a8 + (ulong)(uVar39 == 2) * 4) * fVar54 + fVar46
                             );
        (pIVar23->Scroll).y = fVar47;
        (pIVar23->DC).CursorMaxPos.y = (fVar46 + fVar40) - fVar47;
      }
    }
    IVar41 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar46 = IVar41.x;
    fVar40 = IVar41.y;
    if (((fVar46 != 0.0) || (NAN(fVar46))) && (pIVar23->ScrollbarX == true)) {
      fVar47 = (pIVar23->Scroll).x;
      fVar53 = (float)(int)(fVar46 * fVar54 + fVar47);
      fVar46 = (pIVar23->DC).CursorMaxPos.x;
      (pIVar23->Scroll).x = fVar53;
      (pIVar23->DC).CursorMaxPos.x = (fVar47 + fVar46) - fVar53;
      pIVar15->NavMoveFromClampedRefRect = true;
    }
    if ((fVar40 != 0.0) || (NAN(fVar40))) {
      fVar46 = (pIVar23->Scroll).y;
      fVar40 = (float)(int)(fVar40 * fVar54 + fVar46);
      fVar54 = (pIVar23->DC).CursorMaxPos.y;
      (pIVar23->Scroll).y = fVar40;
      (pIVar23->DC).CursorMaxPos.y = (fVar46 + fVar54) - fVar40;
      pIVar15->NavMoveFromClampedRefRect = true;
    }
  }
  (pIVar15->NavMoveResultLocal).ID = 0;
  (pIVar15->NavMoveResultLocal).ParentID = 0;
  (pIVar15->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar15->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar15->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar15->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar15->NavMoveResultLocal).RectRel.Min.x = 3.4028235e+38;
  *(undefined8 *)&(pIVar15->NavMoveResultLocal).RectRel.Min.y = 0xff7fffff7f7fffff;
  (pIVar15->NavMoveResultLocal).RectRel.Max.y = -3.4028235e+38;
  (pIVar15->NavMoveResultOther).ID = 0;
  (pIVar15->NavMoveResultOther).ParentID = 0;
  (pIVar15->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar15->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar15->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar15->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar15->NavMoveResultOther).RectRel.Min.x = 3.4028235e+38;
  *(undefined8 *)&(pIVar15->NavMoveResultOther).RectRel.Min.y = 0xff7fffff7f7fffff;
  (pIVar15->NavMoveResultOther).RectRel.Max.y = -3.4028235e+38;
  if (((bVar37 != 0) && (pIVar15->NavMoveFromClampedRefRect == true)) && (pIVar15->NavLayer == 0)) {
    IVar41 = (pIVar23->InnerMainRect).Min;
    fVar54 = (pIVar23->Pos).x;
    fVar40 = (pIVar23->Pos).y;
    fVar47 = (IVar41.x - fVar54) + -1.0;
    fVar53 = (IVar41.y - fVar40) + -1.0;
    IVar41 = (pIVar23->InnerMainRect).Max;
    fVar46 = (IVar41.x - fVar54) + 1.0;
    fVar40 = (IVar41.y - fVar40) + 1.0;
    IVar41 = pIVar23->NavRectRel[0].Min;
    fVar57 = IVar41.x;
    fVar54 = pIVar23->NavRectRel[0].Max.x;
    fVar59 = IVar41.y;
    if ((((fVar57 < fVar47) || (fVar59 < fVar53)) || (fVar46 < fVar54)) ||
       (fVar40 < pIVar23->NavRectRel[0].Max.y)) {
      auVar60._0_4_ = pIVar16->FontBaseSize * pIVar23->FontWindowScale * 0.5;
      auVar61._0_4_ = fVar46 - fVar47;
      auVar61._4_4_ = fVar40 - fVar53;
      auVar61._8_8_ = 0;
      auVar60._4_4_ = auVar60._0_4_;
      auVar60._8_4_ = auVar60._0_4_;
      auVar60._12_4_ = auVar60._0_4_;
      auVar62 = minps(auVar61,auVar60);
      fVar47 = fVar47 + auVar62._0_4_;
      fVar53 = fVar53 + auVar62._4_4_;
      uVar38 = -(uint)(fVar47 <= fVar57);
      uVar39 = -(uint)(fVar53 <= fVar59);
      pIVar23->NavRectRel[0].Min =
           (ImVec2)(CONCAT44(~uVar39 & (uint)fVar53,~uVar38 & (uint)fVar47) |
                   CONCAT44((uint)fVar59 & uVar39,(uint)fVar57 & uVar38));
      auVar56._0_4_ = fVar46 - auVar62._0_4_;
      auVar56._4_4_ = fVar40 - auVar62._4_4_;
      auVar56._8_4_ = 0.0 - auVar62._8_4_;
      auVar56._12_4_ = 0.0 - auVar62._12_4_;
      auVar62._4_4_ = pIVar23->NavRectRel[0].Max.y;
      auVar62._0_4_ = fVar54;
      auVar62._8_8_ = 0;
      auVar56 = minps(auVar62,auVar56);
      pIVar23->NavRectRel[0].Max = auVar56._0_8_;
      pIVar15->NavId = 0;
      pIVar23 = pIVar15->NavWindow;
    }
    pIVar15->NavMoveFromClampedRefRect = false;
  }
  if (pIVar23 == (ImGuiWindow *)0x0) {
    fVar54 = (pIVar16->IO).DisplayVisibleMin.x;
    pIVar4 = &(pIVar16->IO).DisplayVisibleMax;
    if ((fVar54 != pIVar4->x) || (NAN(fVar54) || NAN(pIVar4->x))) {
      fVar54 = (pIVar16->IO).DisplayVisibleMin.y;
      pfVar1 = &(pIVar16->IO).DisplayVisibleMax.y;
      if ((fVar54 != *pfVar1) || (NAN(fVar54) || NAN(*pfVar1))) {
        IVar50 = (pIVar16->IO).DisplayVisibleMin;
        IVar43 = (pIVar16->IO).DisplayVisibleMax;
        goto LAB_001647e4;
      }
    }
    IVar43 = (pIVar16->IO).DisplaySize;
    IVar50.x = 0.0;
    IVar50.y = 0.0;
  }
  else {
    IVar41 = pIVar23->NavRectRel[pIVar15->NavLayer].Min;
    IVar48 = pIVar23->NavRectRel[pIVar15->NavLayer].Max;
    IVar42.x = 0.0;
    IVar42.y = 0.0;
    IVar49.x = 0.0;
    IVar49.y = 0.0;
    if (IVar41.y <= IVar48.y && IVar41.x <= IVar48.x) {
      IVar42 = IVar48;
      IVar49 = IVar41;
    }
    fVar54 = (pIVar23->Pos).x;
    IVar50.x = IVar49.x + fVar54;
    fVar46 = (pIVar23->Pos).y;
    IVar50.y = IVar49.y + fVar46;
    IVar43.x = IVar42.x + fVar54;
    IVar43.y = IVar42.y + fVar46;
  }
LAB_001647e4:
  (pIVar15->NavScoringRectScreen).Min = IVar50;
  (pIVar15->NavScoringRectScreen).Max = IVar43;
  fVar54 = IVar50.x + 1.0;
  if (IVar43.x <= fVar54) {
    fVar54 = IVar43.x;
  }
  (pIVar15->NavScoringRectScreen).Min.x = fVar54;
  (pIVar15->NavScoringRectScreen).Max.x = fVar54;
  if (IVar43.y < IVar50.y) {
    __assert_fail("!g.NavScoringRectScreen.IsInverted()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xcf9,"void ImGui::NavUpdate()");
  }
  pIVar15->NavScoringCount = 0;
  fVar54 = (pIVar16->IO).MousePos.x;
  if (((fVar54 < -256000.0) || (fVar46 = (pIVar16->IO).MousePos.y, fVar46 < -256000.0)) ||
     ((fVar40 = (pIVar16->IO).MousePosPrev.x, fVar40 < -256000.0 ||
      (fVar47 = (pIVar16->IO).MousePosPrev.y, fVar47 < -256000.0)))) {
    (pIVar16->IO).MouseDelta.x = 0.0;
    (pIVar16->IO).MouseDelta.y = 0.0;
  }
  else {
    fVar54 = fVar54 - fVar40;
    fVar46 = fVar46 - fVar47;
    IVar55.y = fVar46;
    IVar55.x = fVar54;
    (pIVar16->IO).MouseDelta = IVar55;
    if (((fVar54 != 0.0) || (fVar46 != 0.0)) || (NAN(fVar46))) {
      pIVar16->NavDisableMouseHover = false;
    }
  }
  IVar41 = (pIVar16->IO).MousePos;
  (pIVar16->IO).MousePosPrev = IVar41;
  lVar21 = 0x40a;
  do {
    if (*(char *)((long)pIVar16 + lVar21 + -0x2fa) == '\x01') {
      fVar54 = *(float *)((long)pIVar16 + lVar21 * 4 + -0xc14);
      *(bool *)((long)(pIVar16->IO).KeyMap + lVar21 + -0x46) = fVar54 < 0.0;
      *(undefined1 *)((long)(pIVar16->IO).KeyMap + lVar21 + -0x3c) = 0;
      *(float *)((long)pIVar16 + lVar21 * 4 + -0xc00) = fVar54;
      if (0.0 <= fVar54) {
        *(float *)((long)pIVar16 + lVar21 * 4 + -0xc14) = fVar54 + (pIVar16->IO).DeltaTime;
        *(undefined1 *)((long)(pIVar16->IO).KeyMap + lVar21 + -0x41) = 0;
        uVar5 = *(undefined8 *)((long)pIVar16 + lVar21 * 8 + -0x1c8c);
        uVar6 = *(undefined8 *)((long)pIVar16 + lVar21 * 8 + -0x1c14);
        auVar64._0_4_ = IVar41.x - (float)uVar5;
        auVar64._4_4_ = IVar41.y - (float)((ulong)uVar5 >> 0x20);
        auVar64._8_8_ = 0;
        uVar28 = CONCAT44(auVar64._4_4_,auVar64._0_4_);
        auVar63._0_8_ = uVar28 ^ 0x8000000080000000;
        auVar63._8_4_ = 0x80000000;
        auVar63._12_4_ = 0x80000000;
        auVar56 = maxps(auVar63,auVar64);
        fVar54 = (float)uVar6;
        fVar46 = (float)((ulong)uVar6 >> 0x20);
        uVar38 = -(uint)(auVar56._0_4_ <= fVar54);
        uVar39 = -(uint)(auVar56._4_4_ <= fVar46);
        *(ulong *)((long)pIVar16 + lVar21 * 8 + -0x1c14) =
             CONCAT44(~uVar39 & (uint)auVar56._4_4_,~uVar38 & (uint)auVar56._0_4_) |
             CONCAT44((uint)fVar46 & uVar39,(uint)fVar54 & uVar38);
        fVar54 = *(float *)((long)pIVar16 + lVar21 * 4 + -0xbc4);
        fVar46 = auVar64._0_4_ * auVar64._0_4_ + auVar64._4_4_ * auVar64._4_4_;
        uVar38 = -(uint)(fVar46 <= fVar54);
        *(uint *)((long)pIVar16 + lVar21 * 4 + -0xbc4) =
             uVar38 & (uint)fVar54 | ~uVar38 & (uint)fVar46;
      }
      else {
        *(undefined4 *)((long)pIVar16 + lVar21 * 4 + -0xc14) = 0;
        *(undefined1 *)((long)(pIVar16->IO).KeyMap + lVar21 + -0x41) = 0;
        fVar54 = pIVar16->Time;
        if ((fVar54 - *(float *)((long)pIVar16 + lVar21 * 4 + -0xc3c) <
             (pIVar16->IO).MouseDoubleClickTime) &&
           (fVar40 = IVar41.x - *(float *)((long)pIVar16 + lVar21 * 8 + -0x1c8c),
           fVar47 = IVar41.y - *(float *)((long)pIVar16 + lVar21 * 8 + -0x1c88),
           fVar46 = (pIVar16->IO).MouseDoubleClickMaxDist, fVar54 = -3.4028235e+38,
           fVar40 * fVar40 + fVar47 * fVar47 < fVar46 * fVar46)) {
          *(undefined1 *)((long)(pIVar16->IO).KeyMap + lVar21 + -0x41) = 1;
          fVar54 = -3.4028235e+38;
        }
        *(float *)((long)pIVar16 + lVar21 * 4 + -0xc3c) = fVar54;
        *(ImVec2 *)((long)pIVar16 + lVar21 * 8 + -0x1c8c) = IVar41;
        *(undefined8 *)((long)pIVar16 + lVar21 * 8 + -0x1c14) = 0;
        *(undefined4 *)((long)pIVar16 + lVar21 * 4 + -0xbc4) = 0;
        if ((*(byte *)((long)(pIVar16->IO).KeyMap + lVar21 + -0x46) & 1) != 0) {
          pIVar16->NavDisableMouseHover = false;
        }
      }
    }
    else {
      *(undefined1 *)((long)(pIVar16->IO).KeyMap + lVar21 + -0x46) = 0;
      fVar54 = *(float *)((long)pIVar16 + lVar21 * 4 + -0xc14);
      *(bool *)((long)(pIVar16->IO).KeyMap + lVar21 + -0x3c) = 0.0 <= fVar54;
      *(float *)((long)pIVar16 + lVar21 * 4 + -0xc00) = fVar54;
      *(undefined4 *)((long)pIVar16 + lVar21 * 4 + -0xc14) = 0xbf800000;
      *(undefined1 *)((long)(pIVar16->IO).KeyMap + lVar21 + -0x41) = 0;
    }
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0x40f);
  fVar54 = (pIVar14->IO).DeltaTime;
  iVar29 = pIVar14->FramerateSecPerFrameIdx;
  pIVar14->FramerateSecPerFrameAccum =
       (fVar54 - pIVar14->FramerateSecPerFrame[iVar29]) + pIVar14->FramerateSecPerFrameAccum;
  pIVar14->FramerateSecPerFrame[iVar29] = fVar54;
  iVar20 = iVar29 + (int)((ulong)((long)(iVar29 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar14->FramerateSecPerFrameIdx = iVar29 + 1 + ((iVar20 >> 6) - (iVar20 >> 0x1f)) * -0x78;
  uVar38 = -(uint)(0.0 < pIVar14->FramerateSecPerFrameAccum);
  (pIVar14->IO).Framerate =
       (float)(~uVar38 & 0x7f7fffff |
              (uint)(1.0 / (pIVar14->FramerateSecPerFrameAccum / 120.0)) & uVar38);
  pIVar15 = GImGui;
  pIVar23 = GImGui->MovingWindow;
  if (pIVar23 == (ImGuiWindow *)0x0) {
    if (((GImGui->ActiveIdWindow != (ImGuiWindow *)0x0) &&
        (IVar7 = GImGui->ActiveIdWindow->MoveId, IVar7 == GImGui->ActiveId)) &&
       (GImGui->ActiveIdIsAlive = true, (pIVar15->IO).MouseDown[0] == false)) {
      pIVar15->ActiveIdIsJustActivated = IVar7 != 0;
      if (IVar7 != 0) {
        pIVar15->ActiveIdTimer = 0.0;
      }
      pIVar15->ActiveId = 0;
      pIVar15->ActiveIdAllowNavDirFlags = 0;
      pIVar15->ActiveIdAllowOverlap = false;
      pIVar15->ActiveIdWindow = (ImGuiWindow *)0x0;
    }
  }
  else {
    pIVar2 = &GImGui->ActiveId;
    GImGui->ActiveIdIsAlive = true;
    pIVar26 = pIVar23->RootWindow;
    if (pIVar26 == (ImGuiWindow *)0x0) {
      __assert_fail("g.MovingWindow && g.MovingWindow->RootWindow",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xd0a,"void ImGui::UpdateMovingWindow()");
    }
    if ((((pIVar15->IO).MouseDown[0] != true) ||
        (fVar54 = (pIVar15->IO).MousePos.x, fVar54 < -256000.0)) ||
       (fVar46 = (pIVar15->IO).MousePos.y, fVar46 < -256000.0)) {
      bVar36 = *pIVar2 != 0;
      pIVar15->ActiveIdIsJustActivated = bVar36;
      if (bVar36) {
        pIVar15->ActiveIdTimer = 0.0;
      }
      pIVar15->ActiveId = 0;
      pIVar15->ActiveIdAllowNavDirFlags = 0;
      pIVar15->ActiveIdAllowOverlap = false;
      pIVar15->ActiveIdWindow = (ImGuiWindow *)0x0;
      pIVar15->MovingWindow = (ImGuiWindow *)0x0;
    }
    else {
      local_40.Min.x = fVar54 - (pIVar15->ActiveIdClickOffset).x;
      local_40.Min.y = fVar46 - (pIVar15->ActiveIdClickOffset).y;
      fVar54 = (pIVar26->Pos).x;
      if ((fVar54 != local_40.Min.x) || (NAN(fVar54) || NAN(local_40.Min.x))) {
LAB_00164c7b:
        if (((pIVar26->Flags & 0x100) == 0) && (pIVar15->SettingsDirtyTimer <= 0.0)) {
          pIVar15->SettingsDirtyTimer = (pIVar15->IO).IniSavingRate;
        }
        ::SetWindowPos(pIVar26,&local_40.Min,1);
        pIVar23 = pIVar15->MovingWindow;
      }
      else {
        fVar54 = (pIVar26->Pos).y;
        if ((fVar54 != local_40.Min.y) || (NAN(fVar54) || NAN(local_40.Min.y))) goto LAB_00164c7b;
      }
      FocusWindow(pIVar23);
    }
  }
  NewFrameUpdateHoveredWindowAndCaptureFlags();
  pIVar23 = GetFrontMostPopupModal();
  if (pIVar23 == (ImGuiWindow *)0x0) {
    fVar54 = 0.0;
  }
  else {
    fVar54 = (pIVar14->IO).DeltaTime * 6.0 + pIVar14->ModalWindowDarkeningRatio;
    if (1.0 <= fVar54) {
      fVar54 = 1.0;
    }
  }
  pIVar14->ModalWindowDarkeningRatio = fVar54;
  pIVar14->MouseCursor = 0;
  pIVar14->WantTextInputNextFrame = -1;
  pIVar14->WantCaptureMouseNextFrame = -1;
  pIVar14->WantCaptureKeyboardNextFrame = -1;
  (pIVar14->PlatformImePos).x = 1.0;
  (pIVar14->PlatformImePos).y = 1.0;
  pIVar23 = pIVar14->HoveredWindow;
  if (((pIVar23 != (ImGuiWindow *)0x0) && (pIVar23->Collapsed == false)) &&
     ((fVar54 = (pIVar14->IO).MouseWheel, pIVar26 = pIVar23, fVar54 != 0.0 ||
      ((fVar46 = (pIVar14->IO).MouseWheelH, fVar46 != 0.0 || (NAN(fVar46))))))) {
    do {
      pIVar33 = pIVar26;
      uVar38 = pIVar33->Flags;
      if ((uVar38 & 0x1000218) != 0x1000010) break;
      pIVar26 = pIVar33->ParentWindow;
    } while (pIVar33->ParentWindow != (ImGuiWindow *)0x0);
    if ((fVar54 != 0.0) || (NAN(fVar54))) {
      if ((pIVar14->IO).KeyCtrl == true) {
        if ((pIVar14->IO).FontAllowUserScaling == true) {
          fVar46 = fVar54 * 0.1 + pIVar23->FontWindowScale;
          fVar54 = 2.5;
          if (fVar46 <= 2.5) {
            fVar54 = fVar46;
          }
          fVar54 = (float)(-(uint)(fVar46 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar46 < 0.5) & (uint)fVar54);
          fVar40 = fVar54 / pIVar23->FontWindowScale;
          pIVar23->FontWindowScale = fVar54;
          fVar47 = 1.0 - fVar40;
          uVar65._0_4_ = (pIVar23->Pos).x;
          uVar65._4_4_ = (pIVar23->Pos).y;
          uVar66._0_4_ = (pIVar23->Size).x;
          uVar66._4_4_ = (pIVar23->Size).y;
          fVar54 = (float)((ulong)uVar65 >> 0x20);
          fVar46 = (float)((ulong)uVar66 >> 0x20);
          IVar41 = (pIVar14->IO).MousePos;
          auVar58._8_8_ = uVar66;
          auVar58._0_8_ = uVar66;
          auVar52._0_4_ =
               (IVar41.x - (float)(undefined4)uVar65) * fVar47 * (float)(undefined4)uVar66;
          auVar52._4_4_ = (IVar41.y - fVar54) * fVar47 * fVar46;
          auVar52._8_4_ = (0.0 - (float)(undefined4)uVar66) * fVar47 * (float)(undefined4)uVar66;
          auVar52._12_4_ = (0.0 - fVar46) * fVar47 * fVar46;
          auVar56 = divps(auVar52,auVar58);
          IVar51.x = auVar56._0_4_ + (float)(undefined4)uVar65;
          IVar51.y = auVar56._4_4_ + fVar54;
          auVar13._4_8_ = uVar66;
          auVar13._0_4_ = fVar54 * fVar40;
          auVar45._0_8_ = auVar13._0_8_ << 0x20;
          auVar45._8_4_ = (float)(undefined4)uVar66 * fVar40;
          auVar45._12_4_ = fVar46 * fVar40;
          pIVar23->Pos = IVar51;
          pIVar23->Size = auVar45._8_8_;
          IVar44.x = (pIVar23->SizeFull).x * fVar40;
          IVar44.y = (pIVar23->SizeFull).y * fVar40;
          pIVar23->SizeFull = IVar44;
        }
      }
      else {
        if ((uVar38 & 0x210) != 0) goto LAB_00164d3c;
        fVar40 = GImGui->FontBaseSize * pIVar33->FontWindowScale * 5.0;
        fVar46 = (pIVar33->WindowPadding).y;
        fVar47 = (fVar46 + fVar46 +
                 ((pIVar33->ContentsRegionRect).Max.y - (pIVar33->ContentsRegionRect).Min.y)) * 0.67
        ;
        fVar46 = (pIVar33->Scroll).y;
        if (fVar47 <= fVar40) {
          fVar40 = fVar47;
        }
        fVar47 = (pIVar33->DC).CursorMaxPos.y;
        fVar54 = fVar46 - fVar54 * (float)(int)fVar40;
        (pIVar33->Scroll).y = fVar54;
        (pIVar33->DC).CursorMaxPos.y = (fVar46 + fVar47) - fVar54;
      }
    }
    if ((uVar38 & 0x210) == 0) {
      fVar54 = (pIVar14->IO).MouseWheelH;
      if ((((fVar54 != 0.0) || (NAN(fVar54))) && ((pIVar14->IO).KeyCtrl == false)) &&
         ((pIVar23->Flags & 0x10) == 0)) {
        fVar46 = (pIVar23->Scroll).x;
        fVar40 = (pIVar23->DC).CursorMaxPos.x;
        fVar54 = fVar46 - fVar54 * GImGui->FontBaseSize * pIVar33->FontWindowScale;
        (pIVar23->Scroll).x = fVar54;
        (pIVar23->DC).CursorMaxPos.x = (fVar46 + fVar40) - fVar54;
      }
    }
  }
LAB_00164d3c:
  if (((((pIVar14->ActiveId == 0) && (pIVar23 = pIVar14->NavWindow, pIVar23 != (ImGuiWindow *)0x0))
       && ((pIVar23->Active == true &&
           (((pIVar23->Flags & 0x40000) == 0 && ((pIVar14->IO).KeyCtrl == false)))))) &&
      (iVar29 = (GImGui->IO).KeyMap[0], -1 < iVar29)) &&
     (bVar36 = IsKeyPressed(iVar29,false), bVar36)) {
    if ((pIVar14->NavId == 0) || (pIVar14->NavIdTabCounter == 0x7fffffff)) {
      iVar29 = -(uint)(pIVar14->IO).KeyShift;
    }
    else {
      iVar29 = pIVar14->NavIdTabCounter + (-(uint)(pIVar14->IO).KeyShift | 1) + 1;
    }
    pIVar14->NavWindow->FocusIdxTabRequestNext = iVar29;
  }
  pIVar14->NavIdTabCounter = 0x7fffffff;
  uVar38 = (pIVar14->Windows).Size;
  if ((ulong)uVar38 != 0) {
    uVar28 = 0;
    if (0 < (int)uVar38) {
      uVar28 = (ulong)uVar38;
    }
    uVar32 = 0;
    do {
      if (uVar28 == uVar32) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                      ,0x4c0,
                      "value_type &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      pIVar23 = (pIVar14->Windows).Data[uVar32];
      pIVar23->WasActive = pIVar23->Active;
      pIVar23->Active = false;
      pIVar23->WriteAccessed = false;
      uVar32 = uVar32 + 1;
    } while (uVar38 != uVar32);
  }
  if ((pIVar14->NavWindow != (ImGuiWindow *)0x0) && (pIVar14->NavWindow->WasActive == false)) {
    FocusFrontMostActiveWindow((ImGuiWindow *)0x0);
  }
  if ((pIVar14->CurrentWindowStack).Capacity < 0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    __dest = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    ppIVar11 = (pIVar14->CurrentWindowStack).Data;
    if (ppIVar11 != (ImGuiWindow **)0x0) {
      memcpy(__dest,ppIVar11,(long)(pIVar14->CurrentWindowStack).Size << 3);
      ppIVar11 = (pIVar14->CurrentWindowStack).Data;
      if (ppIVar11 != (ImGuiWindow **)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(ppIVar11,GImAllocatorUserData);
    }
    (pIVar14->CurrentWindowStack).Data = __dest;
    (pIVar14->CurrentWindowStack).Capacity = 0;
  }
  (pIVar14->CurrentWindowStack).Size = 0;
  if ((pIVar14->CurrentPopupStack).Capacity < 0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    __dest_00 = (ImGuiPopupRef *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar12 = (pIVar14->CurrentPopupStack).Data;
    if (pIVar12 != (ImGuiPopupRef *)0x0) {
      memcpy(__dest_00,pIVar12,(long)(pIVar14->CurrentPopupStack).Size * 0x30);
      pIVar12 = (pIVar14->CurrentPopupStack).Data;
      if (pIVar12 != (ImGuiPopupRef *)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(pIVar12,GImAllocatorUserData);
    }
    (pIVar14->CurrentPopupStack).Data = __dest_00;
    (pIVar14->CurrentPopupStack).Capacity = 0;
  }
  (pIVar14->CurrentPopupStack).Size = 0;
  ClosePopupsOverWindow(pIVar14->NavWindow);
  pIVar14 = GImGui;
  (pIVar14->NextWindowData).SizeVal.x = 400.0;
  (pIVar14->NextWindowData).SizeVal.y = 400.0;
  (pIVar14->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() or ImGui::SetCurrentContext()?");
    ImGuiContext& g = *GImGui;

    // Check user data
    // (We pass an error message in the assert expression to make it visible to programmers who are not using a debugger, as most assert handlers display their argument)
    IM_ASSERT(g.Initialized);
    IM_ASSERT(g.IO.DeltaTime >= 0.0f                                    && "Need a positive DeltaTime (zero is tolerated but will cause some timing issues)");
    IM_ASSERT(g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f  && "Invalid DisplaySize value");
    IM_ASSERT(g.IO.Fonts->Fonts.Size > 0                                && "Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?");
    IM_ASSERT(g.IO.Fonts->Fonts[0]->IsLoaded()                          && "Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?");
    IM_ASSERT(g.Style.CurveTessellationTol > 0.0f                       && "Invalid style setting");
    IM_ASSERT(g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f            && "Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)");
    IM_ASSERT((g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount)  && "Forgot to call Render() or EndFrame() at the end of the previous frame?");
    for (int n = 0; n < ImGuiKey_COUNT; n++)
        IM_ASSERT(g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < IM_ARRAYSIZE(g.IO.KeysDown) && "io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)");

    // Perform simple check for required key mapping (we intentionally do NOT check all keys to not pressure user into setting up everything, but Space is required and was only recently added in 1.60 WIP)
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard)
        IM_ASSERT(g.IO.KeyMap[ImGuiKey_Space] != -1 && "ImGuiKey_Space is not mapped, required for keyboard navigation.");

    // Load settings on first frame (if not explicitly loaded manually before)
    if (!g.SettingsLoaded)
    {
        IM_ASSERT(g.SettingsWindows.empty());
        if (g.IO.IniFilename)
            LoadIniSettingsFromDisk(g.IO.IniFilename);
        g.SettingsLoaded = true;
    }

    // Save settings (with a delay after the last modification, so we don't spam disk too much)
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
        {
            if (g.IO.IniFilename != NULL)
                SaveIniSettingsToDisk(g.IO.IniFilename);
            else
                g.IO.WantSaveIniSettings = true;  // Let user know they can call SaveIniSettingsToMemory(). user will need to clear io.WantSaveIniSettings themselves.
            g.SettingsDirtyTimer = 0.0f;
        }
    }

    g.Time += g.IO.DeltaTime;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;

    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;

    g.OverlayDrawList.Clear();
    g.OverlayDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.OverlayDrawList.PushClipRectFullScreen();
    g.OverlayDrawList.Flags = (g.Style.AntiAliasedLines ? ImDrawListFlags_AntiAliasedLines : 0) | (g.Style.AntiAliasedFill ? ImDrawListFlags_AntiAliasedFill : 0);

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it
    g.DrawData.Clear();

    // Clear reference to active widget if the widget isn't alive anymore
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (!g.ActiveIdIsAlive && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.ScalarAsInputTextId && g.ActiveId != g.ScalarAsInputTextId)
        g.ScalarAsInputTextId = 0;

    // Elapse drag & drop payload
    if (g.DragDropActive && g.DragDropPayload.DataFrameCount + 1 < g.FrameCount)
    {
        ClearDragDrop();
        g.DragDropPayloadBufHeap.clear();
        memset(&g.DragDropPayloadBufLocal, 0, sizeof(g.DragDropPayloadBufLocal));
    }
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;

    // Update keyboard input state
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard directional navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMovingWindow();
    NewFrameUpdateHoveredWindowAndCaptureFlags();

    if (GetFrontMostPopupModal() != NULL)
        g.ModalWindowDarkeningRatio = ImMin(g.ModalWindowDarkeningRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.ModalWindowDarkeningRatio = 0.0f;

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    if (g.HoveredWindow && !g.HoveredWindow->Collapsed && (g.IO.MouseWheel != 0.0f || g.IO.MouseWheelH != 0.0f))
    {
        // If a child window has the ImGuiWindowFlags_NoScrollWithMouse flag, we give a chance to scroll its parent (unless either ImGuiWindowFlags_NoInputs or ImGuiWindowFlags_NoScrollbar are also set).
        ImGuiWindow* window = g.HoveredWindow;
        ImGuiWindow* scroll_window = window;
        while ((scroll_window->Flags & ImGuiWindowFlags_ChildWindow) && (scroll_window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(scroll_window->Flags & ImGuiWindowFlags_NoScrollbar) && !(scroll_window->Flags & ImGuiWindowFlags_NoInputs) && scroll_window->ParentWindow)
            scroll_window = scroll_window->ParentWindow;
        const bool scroll_allowed = !(scroll_window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(scroll_window->Flags & ImGuiWindowFlags_NoInputs);

        if (g.IO.MouseWheel != 0.0f)
        {
            if (g.IO.KeyCtrl && g.IO.FontAllowUserScaling)
            {
                // Zoom / Scale window
                const float new_font_scale = ImClamp(window->FontWindowScale + g.IO.MouseWheel * 0.10f, 0.50f, 2.50f);
                const float scale = new_font_scale / window->FontWindowScale;
                window->FontWindowScale = new_font_scale;

                const ImVec2 offset = window->Size * (1.0f - scale) * (g.IO.MousePos - window->Pos) / window->Size;
                window->Pos += offset;
                window->Size *= scale;
                window->SizeFull *= scale;
            }
            else if (!g.IO.KeyCtrl && scroll_allowed)
            {
                // Mouse wheel vertical scrolling
                float scroll_amount = 5 * scroll_window->CalcFontSize();
                scroll_amount = (float)(int)ImMin(scroll_amount, (scroll_window->ContentsRegionRect.GetHeight() + scroll_window->WindowPadding.y * 2.0f) * 0.67f);
                SetWindowScrollY(scroll_window, scroll_window->Scroll.y - g.IO.MouseWheel * scroll_amount);
            }
        }
        if (g.IO.MouseWheelH != 0.0f && scroll_allowed)
        {
            // Mouse wheel horizontal scrolling (for hardware that supports it)
            float scroll_amount = scroll_window->CalcFontSize();
            if (!g.IO.KeyCtrl && !(window->Flags & ImGuiWindowFlags_NoScrollWithMouse))
                SetWindowScrollX(window, window->Scroll.x - g.IO.MouseWheelH * scroll_amount);
        }
    }

    // Pressing TAB activate widget focus
    if (g.ActiveId == 0 && g.NavWindow != NULL && g.NavWindow->Active && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab, false))
    {
        if (g.NavId != 0 && g.NavIdTabCounter != INT_MAX)
            g.NavWindow->FocusIdxTabRequestNext = g.NavIdTabCounter + 1 + (g.IO.KeyShift ? -1 : 1);
        else
            g.NavWindow->FocusIdxTabRequestNext = g.IO.KeyShift ? -1 : 0;
    }
    g.NavIdTabCounter = INT_MAX;

    // Mark all windows as not visible
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->Active = false;
        window->WriteAccessed = false;
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusFrontMostActiveWindow(NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.CurrentPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow);

    // Create implicit window - we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    SetNextWindowSize(ImVec2(400,400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
}